

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::draw_cursor(Fl_Text_Display *this,int X,int Y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_8c;
  int k;
  int bot;
  int fontHeight;
  int nSegs;
  int fontWidth;
  int midY;
  int cursorWidth;
  int right;
  int left;
  Segment segs [5];
  int Y_local;
  int X_local;
  Fl_Text_Display *this_local;
  
  bot = 0;
  iVar1 = this->mMaxsize;
  iVar2 = Y + iVar1 + -1;
  if (((this->text_area).x + -1 <= X) && (X <= (this->text_area).x + (this->text_area).w)) {
    iVar3 = X + -2;
    iVar4 = X + 2;
    if (this->mCursorStyle == 1) {
      segs[0].y2 = iVar2 - iVar1 / 5;
      bot = 4;
      right = iVar3;
      left = iVar2;
      segs[0].x1 = X;
      segs[0].y1 = segs[0].y2;
      segs[0].x2 = X;
      segs[1].x1 = iVar4;
      segs[1].y1 = iVar2;
      segs[1].x2 = iVar3;
      segs[1].y2 = iVar2;
      segs[2].x1 = X;
      segs[2].y1 = segs[0].y2 + -1;
      segs[2].x2 = X;
      segs[2].y2 = segs[0].y2 + -1;
      segs[3].x1 = iVar4;
      segs[3].y1 = iVar2;
    }
    else if (this->mCursorStyle == 0) {
      bot = 3;
      right = iVar3;
      left = Y;
      segs[0].x1 = iVar4;
      segs[0].y1 = Y;
      segs[0].x2 = X;
      segs[0].y2 = Y;
      segs[1].x1 = X;
      segs[1].y1 = iVar2;
      segs[1].x2 = iVar3;
      segs[1].y2 = iVar2;
      segs[2].x1 = iVar4;
      segs[2].y1 = iVar2;
    }
    else if (this->mCursorStyle == 4) {
      right = X + -1;
      segs[0].x1 = X + -1;
      segs[1].x2 = X + 1;
      segs[2].x1 = X + 1;
      bot = 5;
      left = Y;
      segs[0].y1 = iVar2;
      segs[0].x2 = X;
      segs[0].y2 = Y;
      segs[1].x1 = X;
      segs[1].y1 = iVar2;
      segs[1].y2 = Y;
      segs[2].y1 = iVar2;
      segs[2].x2 = iVar3;
      segs[2].y2 = Y;
      segs[3].x1 = iVar4;
      segs[3].y1 = Y;
      segs[3].x2 = iVar3;
      segs[3].y2 = iVar2;
      segs[4].x1 = iVar4;
      segs[4].y1 = iVar2;
    }
    else if (this->mCursorStyle == 2) {
      segs[0].y2 = Y + iVar1 / 2;
      bot = 3;
      right = X;
      left = Y;
      segs[0].x1 = X;
      segs[0].y1 = Y;
      segs[0].x2 = X;
      segs[1].x1 = X;
      segs[1].y1 = segs[0].y2;
      segs[1].x2 = X;
      segs[1].y2 = iVar2;
      segs[2].x1 = X;
      segs[2].y1 = iVar2;
    }
    else if (this->mCursorStyle == 3) {
      segs[0].x1 = X + 6;
      bot = 4;
      right = X;
      left = Y;
      segs[0].y1 = Y;
      segs[0].x2 = segs[0].x1;
      segs[0].y2 = Y;
      segs[1].x1 = segs[0].x1;
      segs[1].y1 = iVar2;
      segs[1].x2 = segs[0].x1;
      segs[1].y2 = iVar2;
      segs[2].x1 = X;
      segs[2].y1 = iVar2;
      segs[2].x2 = X;
      segs[2].y2 = iVar2;
      segs[3].x1 = X;
      segs[3].y1 = Y;
    }
    else if (this->mCursorStyle == 5) {
      segs[0].x2 = X + 1;
      segs[1].x1 = X + 1;
      bot = 2;
      right = X;
      left = Y;
      segs[0].x1 = X;
      segs[0].y1 = iVar2;
      segs[0].y2 = Y;
      segs[1].y1 = iVar2;
    }
    segs[4].x2 = Y;
    segs[4].y2 = X;
    fl_color(this->mCursor_color);
    for (local_8c = 0; local_8c < bot; local_8c = local_8c + 1) {
      fl_line((&right)[(long)local_8c * 4],segs[(long)local_8c + -1].y2,segs[local_8c].x1,
              segs[local_8c].y1);
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_cursor( int X, int Y ) {

  typedef struct {
    int x1, y1, x2, y2;
  }
  Segment;

  Segment segs[ 5 ];
  int left, right, cursorWidth, midY;
  //    int fontWidth = mFontStruct->min_bounds.width, nSegs = 0;
  int fontWidth = TMPFONTWIDTH; // CET - FIXME
  int nSegs = 0;
  int fontHeight = mMaxsize;
  int bot = Y + fontHeight - 1;

  if ( X < text_area.x - 1 || X > text_area.x + text_area.w )
    return;

#ifdef __APPLE__
  Fl::insertion_point_location(X, bot, fontHeight);
#endif
  /* For cursors other than the block, make them around 2/3 of a character
   width, rounded to an even number of pixels so that X will draw an
   odd number centered on the stem at x. */
  cursorWidth = 4;   //(fontWidth/3) * 2;
  left = X - cursorWidth / 2;
  right = left + cursorWidth;

  /* Create segments and draw cursor */
  if ( mCursorStyle == CARET_CURSOR ) {
    midY = bot - fontHeight / 5;
    segs[ 0 ].x1 = left; segs[ 0 ].y1 = bot; segs[ 0 ].x2 = X; segs[ 0 ].y2 = midY;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = midY; segs[ 1 ].x2 = right; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = left; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = X; segs[ 2 ].y2 = midY - 1;
    segs[ 3 ].x1 = X; segs[ 3 ].y1 = midY - 1; segs[ 3 ].x2 = right; segs[ 3 ].y2 = bot;
    nSegs = 4;
  } else if ( mCursorStyle == NORMAL_CURSOR ) {
    segs[ 0 ].x1 = left; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = right; segs[ 0 ].y2 = Y;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = X; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = left; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = right; segs[ 2 ].y2 = bot;
    nSegs = 3;
  } else if ( mCursorStyle == HEAVY_CURSOR ) {
    segs[ 0 ].x1 = X - 1; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = X - 1; segs[ 0 ].y2 = bot;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = X; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = X + 1; segs[ 2 ].y1 = Y; segs[ 2 ].x2 = X + 1; segs[ 2 ].y2 = bot;
    segs[ 3 ].x1 = left; segs[ 3 ].y1 = Y; segs[ 3 ].x2 = right; segs[ 3 ].y2 = Y;
    segs[ 4 ].x1 = left; segs[ 4 ].y1 = bot; segs[ 4 ].x2 = right; segs[ 4 ].y2 = bot;
    nSegs = 5;
  } else if ( mCursorStyle == DIM_CURSOR ) {
    midY = Y + fontHeight / 2;
    segs[ 0 ].x1 = X; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = X; segs[ 0 ].y2 = Y;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = midY; segs[ 1 ].x2 = X; segs[ 1 ].y2 = midY;
    segs[ 2 ].x1 = X; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = X; segs[ 2 ].y2 = bot;
    nSegs = 3;
  } else if ( mCursorStyle == BLOCK_CURSOR ) {
    right = X + fontWidth;
    segs[ 0 ].x1 = X; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = right; segs[ 0 ].y2 = Y;
    segs[ 1 ].x1 = right; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = right; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = right; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = X; segs[ 2 ].y2 = bot;
    segs[ 3 ].x1 = X; segs[ 3 ].y1 = bot; segs[ 3 ].x2 = X; segs[ 3 ].y2 = Y;
    nSegs = 4;
  } else if ( mCursorStyle == SIMPLE_CURSOR ){
    segs[ 0 ].x1 = X; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = X; segs[ 0 ].y2 = bot;
    segs[ 1 ].x1 = X+1; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = X+1; segs[ 1 ].y2 = bot;
    nSegs = 2;
  }
  fl_color( mCursor_color );

  for ( int k = 0; k < nSegs; k++ ) {
    fl_line( segs[ k ].x1, segs[ k ].y1, segs[ k ].x2, segs[ k ].y2 );
  }
}